

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_Hook_amd64_gcc.cpp
# Opt level: O3

void __thiscall axl::spy::HookArena::~HookArena(HookArena *this)

{
  void *pvVar1;
  ExecutableBlockArena<axl::spy::Hook> *this_00;
  
  pvVar1 = this->m_impl;
  sl::Array<void*,axl::sl::ArrayDetails<void*>>::
  setCountImpl<axl::sl::SimpleArrayDetails<void*>::Construct>
            ((Array<void*,axl::sl::ArrayDetails<void*>> *)((long)pvVar1 + 8),0);
  *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  *(undefined8 *)((long)pvVar1 + 0x28) = 0;
  this_00 = (ExecutableBlockArena<axl::spy::Hook> *)this->m_impl;
  if (this_00 != (ExecutableBlockArena<axl::spy::Hook> *)0x0) {
    mem::ExecutableBlockArena<axl::spy::Hook>::~ExecutableBlockArena(this_00);
  }
  operator_delete(this_00);
  return;
}

Assistant:

HookArena::~HookArena() {
	((mem::ExecutableBlockArena<Hook>*)m_impl)->detach(); // don't free unless explicitly requested
	delete (mem::ExecutableBlockArena<Hook>*)m_impl;
}